

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcache.h
# Opt level: O2

QHostInfoCacheElement * __thiscall
QCache<QString,_QHostInfoCache::QHostInfoCacheElement>::relink
          (QCache<QString,_QHostInfoCache::QHostInfoCacheElement> *this,QString *key)

{
  Chain *pCVar1;
  Chain *pCVar2;
  Node *pNVar3;
  QHostInfoCacheElement *pQVar4;
  
  if ((this->d).size != 0) {
    pNVar3 = QHashPrivate::Data<QCache<QString,_QHostInfoCache::QHostInfoCacheElement>::Node>::
             findNode<QString>(&this->d,key);
    if (pNVar3 == (Node *)0x0) {
      pQVar4 = (QHostInfoCacheElement *)0x0;
    }
    else {
      if ((Node *)(this->chain).next != pNVar3) {
        pCVar1 = (pNVar3->super_Chain).prev;
        pCVar2 = (pNVar3->super_Chain).next;
        pCVar1->next = pCVar2;
        pCVar2->prev = pCVar1;
        pCVar1 = (this->chain).next;
        (pNVar3->super_Chain).next = pCVar1;
        pCVar1->prev = &pNVar3->super_Chain;
        (pNVar3->super_Chain).prev = &this->chain;
        (this->chain).next = &pNVar3->super_Chain;
      }
      pQVar4 = (pNVar3->value).t;
    }
    return pQVar4;
  }
  return (QHostInfoCacheElement *)0x0;
}

Assistant:

inline bool isEmpty() const noexcept { return !d.size; }